

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

bool __thiscall Assembler::checkIfEqu(Assembler *this,string *line)

{
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  bool bVar1;
  EquDefError *this_01;
  string local_128;
  string local_108;
  _Self local_e8;
  _Self local_e0;
  string_type local_d8;
  string_type local_b8;
  int local_84;
  string local_80 [4];
  int value;
  string valueString;
  string name;
  smatch equParts;
  string *line_local;
  Assembler *this_local;
  
  this_00 = (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)((long)&name.field_2 + 8);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results(this_00);
  std::__cxx11::string::string((string *)(valueString.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_80);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (line,this_00,&equDirectiveReg_abi_cxx11_,0);
  if (bVar1) {
    if ((first & 1U) != 0) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_b8,
            (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)((long)&name.field_2 + 8),1);
      std::__cxx11::string::operator=
                ((string *)(valueString.field_2._M_local_buf + 8),(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_d8,
            (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)((long)&name.field_2 + 8),2);
      std::__cxx11::string::operator=(local_80,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      local_e0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
           ::find(&this->symbolTable,(key_type *)((long)&valueString.field_2 + 8));
      local_e8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
           ::end(&this->symbolTable);
      bVar1 = std::operator!=(&local_e0,&local_e8);
      if (bVar1) {
        this_01 = (EquDefError *)__cxa_allocate_exception(8);
        *this_01 = (EquDefError)0x0;
        EquDefError::EquDefError(this_01);
        __cxa_throw(this_01,&EquDefError::typeinfo,EquDefError::~EquDefError);
      }
      isGlobalFirst = false;
      std::__cxx11::string::string((string *)&local_108,local_80);
      local_84 = literalToDecimal(this,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::string
                ((string *)&local_128,(string *)(valueString.field_2._M_local_buf + 8));
      processEqu(this,&local_128,local_84);
      std::__cxx11::string::~string((string *)&local_128);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)(valueString.field_2._M_local_buf + 8));
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)((long)&name.field_2 + 8));
  return this_local._7_1_;
}

Assistant:

bool Assembler::checkIfEqu(string line) {
    smatch equParts;
    string name;
    string valueString;
    int value;
    if (regex_match(line, equParts, equDirectiveReg)) {
        if (first) {
            name = equParts.str(1);
            valueString = equParts.str(2);
            if (symbolTable.find(name) != symbolTable.end()) throw EquDefError();
            isGlobalFirst = false;
            value = literalToDecimal(valueString);
            processEqu(name, value);
        }
        return true;
    }
    return false;
}